

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O3

int ctemplate_htmlparser::jsparser_state(jsparser_ctx *ctx)

{
  int iVar1;
  
  iVar1 = ctx->statemachine->current_state;
  if (0xf < (long)iVar1) {
    __assert_fail("state < JSPARSER_NUM_STATES",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                  ,0x7d,"int ctemplate_htmlparser::state_external(int)");
  }
  if (-1 < iVar1) {
    return *(int *)(jsparser_states_external + (long)iVar1 * 4);
  }
  __assert_fail("state >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/htmlparser/jsparser.cc"
                ,0x7e,"int ctemplate_htmlparser::state_external(int)");
}

Assistant:

int jsparser_state(jsparser_ctx *ctx)
{
  return state_external(ctx->statemachine->current_state);
}